

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ParseDefineFlag(cmMakefile *this,string *def,bool remove)

{
  bool bVar1;
  PolicyStatus PVar2;
  int iVar3;
  long lVar4;
  PolicyID id;
  char *pcVar5;
  allocator local_89;
  string ndefs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defs;
  string local_50;
  char *define;
  
  if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::valid == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid),
     iVar3 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseDefineFlag::valid,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::valid,&__dso_handle)
    ;
    __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid);
  }
  bVar1 = cmsys::RegularExpression::find(&ParseDefineFlag::valid,(def->_M_dataplus)._M_p);
  if (bVar1) {
    (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[2])(&ndefs);
    bVar1 = std::operator==(&ndefs,"Visual Studio 6");
    if ((bVar1) && (lVar4 = std::__cxx11::string::find((char *)def,0x49d9be), lVar4 != -1)) {
      lVar4 = std::__cxx11::string::find_first_of((char *)def,0x4a2cad);
      std::__cxx11::string::~string((string *)&ndefs);
      if (lVar4 != -1) {
        return false;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&ndefs);
    }
    if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial == '\0') &&
       (iVar3 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial),
       iVar3 != 0)) {
      cmsys::RegularExpression::RegularExpression
                (&ParseDefineFlag::trivial,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::trivial,
                   &__dso_handle);
      __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial);
    }
    bVar1 = cmsys::RegularExpression::find(&ParseDefineFlag::trivial,(def->_M_dataplus)._M_p);
    if (bVar1) {
LAB_002e8746:
      pcVar5 = (def->_M_dataplus)._M_p + 2;
      define = pcVar5;
      if (remove) {
        std::__cxx11::string::string((string *)&ndefs,"COMPILE_DEFINITIONS",(allocator *)&local_50);
        pcVar5 = GetProperty(this,&ndefs);
        std::__cxx11::string::~string((string *)&ndefs);
        if (pcVar5 != (char *)0x0) {
          defs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          defs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          defs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string((string *)&ndefs,pcVar5,(allocator *)&local_50);
          cmSystemTools::ExpandListArgument(&ndefs,&defs,false);
          std::__cxx11::string::~string((string *)&ndefs);
          local_50._M_string_length =
               (size_type)
               std::
               __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                         ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )defs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )defs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                          (_Iter_equals_val<const_char_*const>)&define);
          local_50._M_dataplus._M_p =
               (pointer)defs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    (&ndefs,(Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&local_50,";");
          std::__cxx11::string::string((string *)&local_50,"COMPILE_DEFINITIONS",&local_89);
          SetProperty(this,&local_50,ndefs._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&ndefs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&defs);
        }
      }
      else {
        std::__cxx11::string::string((string *)&ndefs,"COMPILE_DEFINITIONS",(allocator *)&local_50);
        AppendProperty(this,&ndefs,pcVar5,false);
        std::__cxx11::string::~string((string *)&ndefs);
      }
      return true;
    }
    PVar2 = GetPolicyStatus(this,CMP0005);
    if (PVar2 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&ndefs,(cmPolicies *)0x5,id);
      IssueMessage(this,FATAL_ERROR,&ndefs);
    }
    else {
      if (PVar2 == OLD) {
        return false;
      }
      if (PVar2 != WARN) goto LAB_002e8746;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&ndefs,(cmPolicies *)0x5,id);
      IssueMessage(this,AUTHOR_WARNING,&ndefs);
    }
    std::__cxx11::string::~string((string *)&ndefs);
  }
  return false;
}

Assistant:

bool cmMakefile::ParseDefineFlag(std::string const& def, bool remove)
{
  // Create a regular expression to match valid definitions.
  static cmsys::RegularExpression
    valid("^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$");

  // Make sure the definition matches.
  if(!valid.find(def.c_str()))
    {
    return false;
    }

  // VS6 IDE does not support definition values with spaces in
  // combination with '"', '$', or ';'.
  if((this->GetGlobalGenerator()->GetName() == "Visual Studio 6") &&
     (def.find(" ") != def.npos && def.find_first_of("\"$;") != def.npos))
    {
    return false;
    }

  // Definitions with non-trivial values require a policy check.
  static cmsys::RegularExpression
    trivial("^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
  if(!trivial.find(def.c_str()))
    {
    // This definition has a non-trivial value.
    switch(this->GetPolicyStatus(cmPolicies::CMP0005))
      {
      case cmPolicies::WARN:
        this->IssueMessage(
          cmake::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0005)
          );
      case cmPolicies::OLD:
        // OLD behavior is to not escape the value.  We should not
        // convert the definition to use the property.
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0005)
          );
        return false;
      case cmPolicies::NEW:
        // NEW behavior is to escape the value.  Proceed to convert it
        // to an entry in the property.
        break;
      }
    }

  // Get the definition part after the flag.
  const char* define = def.c_str() + 2;

  if(remove)
    {
    if(const char* cdefs = this->GetProperty("COMPILE_DEFINITIONS"))
      {
      // Expand the list.
      std::vector<std::string> defs;
      cmSystemTools::ExpandListArgument(cdefs, defs);

      // Recompose the list without the definition.
      std::vector<std::string>::const_iterator defEnd =
          std::remove(defs.begin(), defs.end(), define);
      std::vector<std::string>::const_iterator defBegin =
          defs.begin();
      std::string ndefs = cmJoin(cmRange(defBegin, defEnd), ";");

      // Store the new list.
      this->SetProperty("COMPILE_DEFINITIONS", ndefs.c_str());
      }
    }
  else
    {
    // Append the definition to the directory property.
    this->AppendProperty("COMPILE_DEFINITIONS", define);
    }

  return true;
}